

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O0

Vec3 __thiscall
vkt::sr::anon_unknown_0::MatrixCaseUtils::reduceToVec3(MatrixCaseUtils *this,Mat4x3 *value)

{
  Vector<float,_3> *pVVar1;
  Vector<float,_3> *b;
  Vector<float,_3> VVar2;
  Vec3 VVar3;
  Vector<float,_3> local_30;
  Vector<float,_3> local_24;
  Matrix<float,_3,_4> *local_18;
  Mat4x3 *value_local;
  float fVar4;
  
  local_18 = value;
  value_local = (Mat4x3 *)this;
  pVVar1 = tcu::Matrix<float,_3,_4>::getColumn(value,0);
  b = tcu::Matrix<float,_3,_4>::getColumn(local_18,1);
  tcu::operator+((tcu *)&local_30,pVVar1,b);
  pVVar1 = tcu::Matrix<float,_3,_4>::getColumn(local_18,2);
  tcu::operator+((tcu *)&local_24,&local_30,pVVar1);
  pVVar1 = tcu::Matrix<float,_3,_4>::getColumn(local_18,3);
  VVar2 = tcu::operator+((tcu *)this,&local_24,pVVar1);
  VVar3.m_data[0] = VVar2.m_data[0];
  VVar3.m_data[1] = VVar2.m_data[1];
  register0x00001240 = VVar2.m_data[2];
  return (Vec3)VVar3.m_data;
}

Assistant:

inline tcu::Vec3 reduceToVec3 (const tcu::Mat4x3& value)	{ return value.getColumn(0) + value.getColumn(1) + value.getColumn(2) + value.getColumn(3); }